

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.c
# Opt level: O3

int mustache_buffer_insert(MUSTACHE_BUFFER *buf,off_t off,void *data,size_t n)

{
  size_t __size;
  uint8_t *__ptr;
  ulong uVar1;
  
  __ptr = buf->data;
  uVar1 = buf->n;
  if (buf->alloc < uVar1 + n) {
    __size = (uVar1 + n) * 2;
    __ptr = (uint8_t *)realloc(__ptr,__size);
    if (__ptr == (uint8_t *)0x0) {
      return -1;
    }
    buf->data = __ptr;
    buf->alloc = __size;
    uVar1 = buf->n;
  }
  if ((ulong)off <= uVar1 && uVar1 - off != 0) {
    memmove(__ptr + off + n,__ptr + off,uVar1 - off);
    __ptr = buf->data;
  }
  memcpy(__ptr + off,data,n);
  buf->n = buf->n + n;
  return 0;
}

Assistant:

static int
mustache_buffer_insert(MUSTACHE_BUFFER* buf, off_t off, const void* data, size_t n)
{
    if(buf->n + n > buf->alloc) {
        size_t new_alloc = (buf->n + n) * 2;
        uint8_t* new_data;

        new_data = (uint8_t*) realloc(buf->data, new_alloc);
        if(new_data == NULL)
            return -1;

        buf->data = new_data;
        buf->alloc = new_alloc;
    }

    if(off < buf->n)
        memmove(buf->data + off + n, buf->data + off, buf->n - off);

    memcpy(buf->data + off, data, n);
    buf->n += n;
    return 0;
}